

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_host.c
# Opt level: O1

int loader_host_register
              (loader_impl host,context ctx,char *name,loader_register_invoke invoke,function *func,
              type_id return_type,size_t arg_size,type_id *args_type_id)

{
  int iVar1;
  function pfVar2;
  undefined8 uVar3;
  char *pcVar4;
  type ptVar5;
  undefined8 uVar6;
  size_t iterator;
  size_t sVar7;
  
  pfVar2 = (function)function_create(name,arg_size,invoke,function_host_singleton);
  iVar1 = 1;
  if (pfVar2 != (function)0x0) {
    uVar3 = function_signature();
    if (arg_size != 0) {
      sVar7 = 0;
      do {
        pcVar4 = (char *)type_id_name(args_type_id[sVar7]);
        ptVar5 = loader_impl_type(host,pcVar4);
        signature_set(uVar3,sVar7,"",ptVar5);
        sVar7 = sVar7 + 1;
      } while (arg_size != sVar7);
    }
    pcVar4 = (char *)type_id_name(return_type);
    ptVar5 = loader_impl_type(host,pcVar4);
    signature_set_return(uVar3,ptVar5);
    if (name != (char *)0x0) {
      if (ctx == (context)0x0) {
        ctx = loader_impl_context(host);
      }
      uVar3 = context_scope(ctx);
      uVar6 = value_create_function(pfVar2);
      iVar1 = scope_define(uVar3,name,uVar6);
      if (iVar1 != 0) {
        value_type_destroy(uVar6);
        return 1;
      }
    }
    iVar1 = 0;
    if (func != (function *)0x0) {
      *func = pfVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int loader_host_register(loader_impl host, context ctx, const char *name, loader_register_invoke invoke, function *func, type_id return_type, size_t arg_size, type_id args_type_id[])
{
	void **invoke_ptr = (void *)&invoke;

	function f = function_create(name, arg_size, *invoke_ptr, &function_host_singleton);

	if (f == NULL)
	{
		return 1;
	}

	signature s = function_signature(f);

	if (arg_size > 0)
	{
		size_t iterator;

		for (iterator = 0; iterator < arg_size; ++iterator)
		{
			static const char empty_argument_name[] = "";

			type t = loader_impl_type(host, type_id_name(args_type_id[iterator]));

			signature_set(s, iterator, empty_argument_name, t);
		}
	}

	type t = loader_impl_type(host, type_id_name(return_type));

	signature_set_return(s, t);

	if (name != NULL)
	{
		if (ctx == NULL)
		{
			ctx = loader_impl_context(host);
		}

		scope sp = context_scope(ctx);
		value v = value_create_function(f);

		if (scope_define(sp, name, v) != 0)
		{
			value_type_destroy(v);
			return 1;
		}
	}

	if (func != NULL)
	{
		*func = f;
	}

	return 0;
}